

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lookup.cpp
# Opt level: O2

Symbol * __thiscall
slang::ast::Lookup::selectChild
          (Lookup *this,Symbol *initialSymbol,
          span<const_slang::syntax::ElementSelectSyntax_*const,_18446744073709551615UL> selectors,
          ASTContext *context,LookupResult *result)

{
  bitmask<slang::ast::ASTFlags> *this_00;
  SymbolKind SVar1;
  int iVar2;
  SyntaxNode *this_01;
  SVInt *this_02;
  BumpAllocator *args;
  int iVar3;
  bool bVar4;
  logic_t lVar5;
  optional<int> oVar6;
  _Storage<slang::ConstantRange,_true> _Var7;
  _Optional_payload_base<int> _Var8;
  Diagnostic *this_03;
  Diagnostic *pDVar9;
  __extent_storage<18446744073709551615UL> this_04;
  DiagCode code;
  DiagCode code_00;
  size_t sVar10;
  SourceLocation noteLocation;
  int iVar11;
  Scope *pSVar12;
  _Storage<int,_true> _Var13;
  ElementSelectSyntax *this_05;
  ElementSelectSyntax *this_06;
  long lVar14;
  _Storage<int,_true> _Var15;
  SourceRange SVar16;
  optional<slang::ConstantRange> oVar17;
  int32_t idx;
  int iStack_bc;
  char *local_b8;
  ConstantRange newRange;
  int32_t translated;
  undefined4 uStack_a4;
  __extent_storage<18446744073709551615UL> local_a0;
  SyntaxNode *local_98;
  InstanceArraySymbol *local_90;
  Symbol *local_88;
  Symbol *local_80;
  pointer local_78;
  long local_70;
  ElementSelectSyntax *syntax;
  SourceLocation local_60;
  anon_class_24_3_3cd28926 selectorError;
  Token local_40;
  
  this_04 = selectors._M_extent._M_extent_value;
  local_88 = (Symbol *)(&initialSymbol->kind + (long)selectors._M_ptr * 2);
  this_00 = &context[4].flags;
  this_05 = (ElementSelectSyntax *)0x0;
  do {
    if (initialSymbol == local_88) {
      return &((InstanceArraySymbol *)this)->super_Symbol;
    }
    this_06 = *(ElementSelectSyntax **)initialSymbol;
    SVar1 = (((InstanceArraySymbol *)this)->super_Symbol).kind;
    syntax = this_06;
    if ((SVar1 != InstanceArray) && (SVar1 != GenerateBlockArray)) {
      pSVar12 = *(Scope **)this_04._M_extent_value;
      SVar16 = slang::syntax::SyntaxNode::sourceRange(&this_06->super_SyntaxNode);
      pDVar9 = LookupResult::addDiag((LookupResult *)context,pSVar12,(DiagCode)0x2e000a,SVar16);
      Diagnostic::operator<<(pDVar9,(((InstanceArraySymbol *)this)->super_Symbol).name);
      noteLocation = (((InstanceArraySymbol *)this)->super_Symbol).location;
LAB_00729a0a:
      Diagnostic::addNote(pDVar9,(DiagCode)0x50001,noteLocation);
      return (Symbol *)0x0;
    }
    selectorError.syntax = &syntax;
    this_01 = &this_06->selector->super_SyntaxNode;
    selectorError.result = (LookupResult *)context;
    selectorError.context = (ASTContext *)this_04._M_extent_value;
    if (this_01 == (SyntaxNode *)0x0) {
LAB_007298cf:
      selectChild::anon_class_24_3_3cd28926::operator()(&selectorError);
      return (Symbol *)0x0;
    }
    if (this_05 != (ElementSelectSyntax *)0x0) {
      pSVar12 = *(Scope **)this_04._M_extent_value;
      SVar16 = slang::syntax::SyntaxNode::sourceRange(&this_06->super_SyntaxNode);
      pDVar9 = LookupResult::addDiag((LookupResult *)context,pSVar12,(DiagCode)0x940007,SVar16);
      SVar16 = slang::syntax::SyntaxNode::sourceRange(&this_05->super_SyntaxNode);
      Diagnostic::operator<<(pDVar9,SVar16);
      return (Symbol *)0x0;
    }
    local_80 = initialSymbol;
    if (this_01->kind != BitSelect) {
      if (SVar1 != InstanceArray) goto LAB_007298cf;
      if ((SVInt *)(((InstanceArraySymbol *)this)->elements)._M_extent._M_extent_value ==
          (SVInt *)0x0) {
        return (Symbol *)0x0;
      }
      _Var7._M_value =
           (ConstantRange)
           ASTContext::evalInteger
                     ((ASTContext *)this_04._M_extent_value,*(ExpressionSyntax **)(this_01 + 1),
                      (bitmask<slang::ast::ASTFlags>)0x0);
      _Var8 = (_Optional_payload_base<int>)
              ASTContext::evalInteger
                        ((ASTContext *)this_04._M_extent_value,*(ExpressionSyntax **)(this_01 + 2),
                         (bitmask<slang::ast::ASTFlags>)0x0);
      if (((ulong)_Var7 & 0x100000000) == 0) {
        return (Symbol *)0x0;
      }
      if (((ulong)_Var8 & 0x100000000) == 0) {
        return (Symbol *)0x0;
      }
      _Var13._M_value = _Var7._M_value.left;
      _Var15 = _Var8._M_payload;
      if (this_01->kind == SimpleRangeSelect) {
        if (_Var15._M_value <= _Var13._M_value !=
            (((InstanceArraySymbol *)this)->range).right <=
            (((InstanceArraySymbol *)this)->range).left) {
          iVar11 = _Var13._M_value - _Var15._M_value;
          if (_Var13._M_value - _Var15._M_value == 0 || _Var13._M_value < _Var15._M_value) {
            iVar11 = -(_Var13._M_value - _Var15._M_value);
          }
          if (iVar11 - 1U < 0xfffffffe) {
            pSVar12 = *(Scope **)this_04._M_extent_value;
            SVar16 = slang::syntax::SyntaxNode::sourceRange(this_01);
            code.subsystem = Lookup;
            code.code = 0x11;
            goto LAB_00729947;
          }
        }
      }
      else {
        if (_Var15._M_value < 1) {
          pSVar12 = *(Scope **)this_04._M_extent_value;
          SVar16 = slang::syntax::SyntaxNode::sourceRange(*(SyntaxNode **)(this_01 + 2));
          code_00.subsystem = Numeric;
          code_00.code = 8;
LAB_00729a55:
          LookupResult::addDiag((LookupResult *)context,pSVar12,code_00,SVar16);
          return (Symbol *)0x0;
        }
        oVar17 = ConstantRange::getIndexedRange
                           (_Var13._M_value,_Var15._M_value,
                            (((InstanceArraySymbol *)this)->range).right <=
                            (((InstanceArraySymbol *)this)->range).left,
                            this_01->kind == AscendingRangeSelect);
        _Var7 = oVar17.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                super__Optional_payload_base<slang::ConstantRange>._M_payload;
        if (((undefined1  [12])
             oVar17.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
             super__Optional_payload_base<slang::ConstantRange> & (undefined1  [12])0x1) ==
            (undefined1  [12])0x0) {
          pSVar12 = *(Scope **)this_04._M_extent_value;
          SVar16 = slang::syntax::SyntaxNode::sourceRange(this_01);
          code_00.subsystem = Expressions;
          code_00.code = 0x8b;
          goto LAB_00729a55;
        }
        _Var8 = (_Optional_payload_base<int>)((ulong)_Var7 >> 0x20);
      }
      _Var15._M_value = _Var7._M_value.left;
      bVar4 = ConstantRange::containsPoint(&((InstanceArraySymbol *)this)->range,_Var15._M_value);
      if (bVar4) {
        _Var13 = _Var8._M_payload;
        bVar4 = ConstantRange::containsPoint(&((InstanceArraySymbol *)this)->range,_Var13._M_value);
        if (bVar4) {
          iVar11 = (((InstanceArraySymbol *)this)->range).left;
          iVar2 = (((InstanceArraySymbol *)this)->range).right;
          if (iVar2 < iVar11) {
            iVar11 = iVar2;
          }
          iVar2 = _Var13._M_value - iVar11;
          iVar3 = _Var15._M_value - iVar11;
          if (_Var15._M_value - _Var13._M_value != 0 && _Var13._M_value <= _Var15._M_value) {
            iVar2 = _Var15._M_value - iVar11;
            iVar3 = _Var13._M_value - iVar11;
          }
          sVar10 = (long)(iVar2 - iVar3) + 1;
          local_a0._M_extent_value =
               (long)(((InstanceArraySymbol *)this)->elements)._M_extent._M_extent_value -
               (long)iVar3;
          if (sVar10 != 0xffffffffffffffff) {
            local_a0._M_extent_value = sVar10;
          }
          _translated = (uint64_t *)((((InstanceArraySymbol *)this)->elements)._M_ptr + iVar3);
          newRange.left = _Var15._M_value - (int)_Var13;
          if (_Var15._M_value - (int)_Var13 == 0 || _Var15._M_value < _Var13._M_value) {
            newRange.left = -(_Var15._M_value - _Var13._M_value);
          }
          newRange.right = 0;
          if (_Var15._M_value < _Var13._M_value) {
            newRange = (ConstantRange)((ulong)(uint)newRange.left << 0x20);
          }
          args = (BumpAllocator *)**(undefined8 **)this_04._M_extent_value;
          _idx = 0;
          local_b8 = "";
          local_40 = slang::syntax::SyntaxNode::getFirstToken(this_01);
          local_60 = parsing::Token::location(&local_40);
          this = (Lookup *)
                 BumpAllocator::
                 emplace<slang::ast::InstanceArraySymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,std::span<slang::ast::Symbol_const*const,18446744073709551615ul>&,slang::ConstantRange&>
                           (args,(Compilation *)args,
                            (basic_string_view<char,_std::char_traits<char>_> *)&idx,&local_60,
                            (span<const_slang::ast::Symbol_*const,_18446744073709551615UL> *)
                            &translated,&newRange);
          _idx = CONCAT44(iVar2,iVar3);
          SmallVectorBase<slang::ast::HierarchicalReference::Element>::
          emplace_back<slang::ast::InstanceArraySymbol&,std::pair<int,int>>
                    ((SmallVectorBase<slang::ast::HierarchicalReference::Element> *)this_00,
                     (InstanceArraySymbol *)this,(pair<int,_int> *)&idx);
          goto LAB_007298be;
        }
      }
      pSVar12 = *(Scope **)this_04._M_extent_value;
      SVar16 = slang::syntax::SyntaxNode::sourceRange(this_01);
      code.subsystem = Lookup;
      code.code = 2;
LAB_00729947:
      pDVar9 = LookupResult::addDiag((LookupResult *)context,pSVar12,code,SVar16);
      this_03 = Diagnostic::operator<<<int>(pDVar9,_Var7._M_value.left);
      Diagnostic::operator<<<int>(this_03,_Var8._M_payload._M_value);
      pDVar9 = Diagnostic::operator<<<int>(pDVar9,(((InstanceArraySymbol *)this)->range).left);
      Diagnostic::operator<<<int>(pDVar9,(((InstanceArraySymbol *)this)->range).right);
      return (Symbol *)0x0;
    }
    local_98 = this_01;
    oVar6 = ASTContext::evalInteger
                      ((ASTContext *)this_04._M_extent_value,*(ExpressionSyntax **)(this_01 + 1),
                       (bitmask<slang::ast::ASTFlags>)0x0);
    if (((ulong)oVar6.super__Optional_base<int,_true,_true>._M_payload.
                super__Optional_payload_base<int> & 0x100000000) == 0) {
      return (Symbol *)0x0;
    }
    _Var15._M_value =
         oVar6.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
         _M_payload;
    if ((((InstanceArraySymbol *)this)->super_Symbol).kind == InstanceArray) {
      if ((SVInt *)(((InstanceArraySymbol *)this)->elements)._M_extent._M_extent_value ==
          (SVInt *)0x0) {
        return (Symbol *)0x0;
      }
      bVar4 = ConstantRange::containsPoint(&((InstanceArraySymbol *)this)->range,_Var15._M_value);
      if (!bVar4) {
        pSVar12 = *(Scope **)this_04._M_extent_value;
        SVar16 = slang::syntax::SyntaxNode::sourceRange(local_98);
        pDVar9 = LookupResult::addDiag((LookupResult *)context,pSVar12,(DiagCode)0x2d000a,SVar16);
        Diagnostic::operator<<<int>(pDVar9,_Var15._M_value);
        noteLocation = (((InstanceArraySymbol *)this)->super_Symbol).location;
        goto LAB_00729a0a;
      }
      iVar11 = (((InstanceArraySymbol *)this)->range).left;
      iVar2 = (((InstanceArraySymbol *)this)->range).right;
      if (iVar2 < iVar11) {
        iVar11 = iVar2;
      }
      translated = _Var15._M_value - iVar11;
      this = (Lookup *)(((InstanceArraySymbol *)this)->elements)._M_ptr[_Var15._M_value - iVar11];
      SmallVectorBase<slang::ast::HierarchicalReference::Element>::
      emplace_back<slang::ast::Symbol_const&,int&>
                ((SmallVectorBase<slang::ast::HierarchicalReference::Element> *)this_00,
                 (Symbol *)this,&translated);
    }
    else {
      if ((char)(((InstanceArraySymbol *)this)->range).right != '\x01') {
        return (Symbol *)0x0;
      }
      _idx = _idx & 0xffffffff00000000;
      local_78 = (((InstanceArraySymbol *)this)->elements)._M_ptr;
      local_70 = (long)(((InstanceArraySymbol *)this)->elements)._M_extent._M_extent_value << 3;
      iVar11 = 1;
      local_90 = (InstanceArraySymbol *)this;
      for (lVar14 = 0; local_70 != lVar14; lVar14 = lVar14 + 8) {
        this = *(Lookup **)((long)local_78 + lVar14);
        this_02 = (SVInt *)(((InstanceArraySymbol *)this)->elements)._M_extent._M_extent_value;
        SVInt::SVInt<int>((SVInt *)&translated,_Var15._M_value);
        lVar5 = SVInt::operator==(this_02,(SVInt *)&translated);
        SVInt::~SVInt((SVInt *)&translated);
        if (((lVar5.value != '\0') && (lVar5.value != 0x80)) && (lVar5.value != '@')) {
          SmallVectorBase<slang::ast::HierarchicalReference::Element>::
          emplace_back<slang::ast::GenerateBlockSymbol_const&,int&>
                    ((SmallVectorBase<slang::ast::HierarchicalReference::Element> *)this_00,
                     (GenerateBlockSymbol *)this,&idx);
          goto LAB_007298b2;
        }
        _idx = CONCAT44(iStack_bc,iVar11);
        iVar11 = iVar11 + 1;
      }
      pSVar12 = *(Scope **)this_04._M_extent_value;
      SVar16 = slang::syntax::SyntaxNode::sourceRange(local_98);
      pDVar9 = LookupResult::addDiag((LookupResult *)context,pSVar12,(DiagCode)0x2d000a,SVar16);
      Diagnostic::operator<<<int>(pDVar9,_Var15._M_value);
      Diagnostic::addNote(pDVar9,(DiagCode)0x50001,(local_90->super_Symbol).location);
      this = (Lookup *)0x0;
    }
LAB_007298b2:
    if ((InstanceArraySymbol *)this == (InstanceArraySymbol *)0x0) {
      return (Symbol *)0x0;
    }
    this_06 = (ElementSelectSyntax *)0x0;
LAB_007298be:
    initialSymbol = (Symbol *)&local_80->name;
    this_05 = this_06;
  } while( true );
}

Assistant:

const Symbol* Lookup::selectChild(const Symbol& initialSymbol,
                                  std::span<const ElementSelectSyntax* const> selectors,
                                  const ASTContext& context, LookupResult& result) {
    const Symbol* symbol = &initialSymbol;
    const SyntaxNode* prevRangeSelect = nullptr;
    for (const ElementSelectSyntax* syntax : selectors) {
        if (symbol->kind != SymbolKind::InstanceArray &&
            symbol->kind != SymbolKind::GenerateBlockArray) {
            // I think it's safe to assume that the symbol name here will not be empty
            // because if it was, it'd be an instance array or generate array.
            auto& diag = result.addDiag(*context.scope, diag::ScopeNotIndexable,
                                        syntax->sourceRange());
            diag << symbol->name;
            diag.addNote(diag::NoteDeclarationHere, symbol->location);
            return nullptr;
        }

        auto selectorError = [&]() -> const Symbol* {
            result.addDiag(*context.scope, diag::InvalidScopeIndexExpression,
                           syntax->sourceRange());
            return nullptr;
        };

        if (!syntax->selector)
            return selectorError();

        if (prevRangeSelect) {
            result.addDiag(*context.scope, diag::SelectAfterRangeSelect, syntax->sourceRange())
                << prevRangeSelect->sourceRange();
            return nullptr;
        }

        switch (syntax->selector->kind) {
            case SyntaxKind::BitSelect:
                symbol = selectSingleChild(*symbol, syntax->selector->as<BitSelectSyntax>(),
                                           context, result);
                if (!symbol)
                    return nullptr;
                break;
            case SyntaxKind::SimpleRangeSelect:
            case SyntaxKind::AscendingRangeSelect:
            case SyntaxKind::DescendingRangeSelect:
                prevRangeSelect = syntax;
                if (symbol->kind != SymbolKind::InstanceArray)
                    return selectorError();

                symbol = selectChildRange(symbol->as<InstanceArraySymbol>(),
                                          syntax->selector->as<RangeSelectSyntax>(), context,
                                          result);
                if (!symbol)
                    return nullptr;
                break;
            default:
                SLANG_UNREACHABLE;
        }
    }

    return symbol;
}